

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_tracker_connection::fail
          (udp_tracker_connection *this,error_code *ec,operation_t op,char *msg,seconds32 interval,
          seconds32 min_interval)

{
  bool bVar1;
  uint uVar2;
  int read_timeout;
  tracker_request *ptVar3;
  undefined8 uVar4;
  reference ep;
  element_type *peVar5;
  undefined8 uVar6;
  session_settings *this_00;
  undefined1 auVar7 [16];
  int local_200;
  session_settings *settings;
  code *local_188;
  undefined8 local_180;
  type local_178;
  executor_type local_158;
  string local_128;
  endpoint local_104;
  string local_e8;
  string local_c8;
  undefined1 local_98 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  const_iterator local_78;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  local_70;
  endpoint local_64;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  local_48;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  local_40;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  local_38;
  __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  i;
  char *msg_local;
  operation_t op_local;
  error_code *ec_local;
  udp_tracker_connection *this_local;
  seconds32 min_interval_local;
  seconds32 interval_local;
  
  i._M_current = (basic_endpoint<boost::asio::ip::tcp> *)msg;
  local_40._M_current =
       (basic_endpoint<boost::asio::ip::tcp> *)
       ::std::
       vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
       ::begin(&this->m_endpoints);
  local_48._M_current =
       (basic_endpoint<boost::asio::ip::tcp> *)
       ::std::
       vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
       ::end(&this->m_endpoints);
  make_tcp(&local_64,&this->m_target);
  local_38 = ::std::
             find<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                       (local_40,local_48,&local_64);
  local_70._M_current =
       (basic_endpoint<boost::asio::ip::tcp> *)
       ::std::
       vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
       ::end(&this->m_endpoints);
  bVar1 = __gnu_cxx::operator!=(&local_38,&local_70);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>
    ::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>*>
              ((__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>
                *)&local_78,&local_38);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ::erase(&this->m_endpoints,local_78);
  }
  bVar1 = ::std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ::empty(&this->m_endpoints);
  if (!bVar1) {
    ptVar3 = tracker_connection::tracker_req(&this->super_tracker_connection);
    bVar1 = listen_socket_handle::operator_cast_to_bool(&ptVar3->outgoing_socket);
    if (bVar1) {
      tracker_connection::requester((tracker_connection *)local_98);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
      if (bVar1) {
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
        uVar2 = (*peVar5->_vptr_request_callback[6])();
        if ((uVar2 & 1) != 0) {
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_98);
          auVar7 = ::std::__cxx11::string::c_str();
          print_endpoint_abi_cxx11_(&local_c8,(aux *)&this->m_target,auVar7._8_8_);
          uVar6 = ::std::__cxx11::string::c_str();
          boost::system::error_code::message_abi_cxx11_(&local_e8,ec);
          uVar4 = ::std::__cxx11::string::c_str();
          (*peVar5->_vptr_request_callback[7])
                    (peVar5,"*** UDP_TRACKER [ host: \"%s\" ip: \"%s\" | ERROR: \"%s\" ]",
                     auVar7._0_8_,uVar6,uVar4);
          ::std::__cxx11::string::~string((string *)&local_e8);
          ::std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      ep = ::std::
           vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ::front(&this->m_endpoints);
      make_udp(&local_104,ep);
      boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::operator=(&this->m_target,&local_104);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
      if (bVar1) {
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
        uVar2 = (*peVar5->_vptr_request_callback[6])();
        if ((uVar2 & 1) != 0) {
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_98);
          auVar7 = ::std::__cxx11::string::c_str();
          print_endpoint_abi_cxx11_(&local_128,(aux *)&this->m_target,auVar7._8_8_);
          uVar6 = ::std::__cxx11::string::c_str();
          (*peVar5->_vptr_request_callback[7])
                    (peVar5,"*** UDP_TRACKER trying next IP [ host: \"%s\" ip: \"%s\" ]",
                     auVar7._0_8_,uVar6);
          ::std::__cxx11::string::~string((string *)&local_128);
        }
      }
      timeout_handler::get_executor(&local_158,(timeout_handler *)this);
      local_188 = start_announce;
      local_180._0_4_ = 0;
      local_180._4_4_ = 0;
      shared_from_this((udp_tracker_connection *)&settings);
      ::std::
      bind<void(libtorrent::aux::udp_tracker_connection::*)(),std::shared_ptr<libtorrent::aux::udp_tracker_connection>>
                (&local_178,(offset_in_udp_tracker_connection_to_subr *)&local_188,
                 (shared_ptr<libtorrent::aux::udp_tracker_connection> *)&settings);
      boost::asio::
      post<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,std::_Bind<void(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>>
                (&local_158,&local_178,(type *)0x0);
      ::std::
      _Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>))()>
      ::~_Bind(&local_178);
      ::std::shared_ptr<libtorrent::aux::udp_tracker_connection>::~shared_ptr
                ((shared_ptr<libtorrent::aux::udp_tracker_connection> *)&settings);
      boost::asio::execution::
      any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>
      ::~any_executor(&local_158);
      this_00 = tracker_manager::settings((this->super_tracker_connection).m_man);
      ptVar3 = tracker_connection::tracker_req(&this->super_tracker_connection);
      if (ptVar3->event == stopped) {
        local_200 = session_settings::get_int(this_00,0x4002);
      }
      else {
        local_200 = session_settings::get_int(this_00,0x4000);
      }
      read_timeout = session_settings::get_int(this_00,0x4001);
      timeout_handler::set_timeout((timeout_handler *)this,local_200,read_timeout);
      ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
                ((shared_ptr<libtorrent::aux::request_callback> *)local_98);
      return;
    }
  }
  cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = min_interval.__r;
  cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = interval.__r;
  tracker_connection::fail
            (&this->super_tracker_connection,ec,op,(char *)i._M_current,interval,min_interval);
  return;
}

Assistant:

void udp_tracker_connection::fail(error_code const& ec, operation_t const op
		, char const* msg, seconds32 const interval, seconds32 const min_interval)
	{
		// m_target failed. remove it from the endpoint list
		auto const i = std::find(m_endpoints.begin()
			, m_endpoints.end(), make_tcp(m_target));

		if (i != m_endpoints.end()) m_endpoints.erase(i);

		// if that was the last one, or the listen socket was closed
		// fail the whole announce
		if (m_endpoints.empty() || !tracker_req().outgoing_socket)
		{
			tracker_connection::fail(ec, op, msg, interval, min_interval);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER [ host: "%s" ip: "%s" | ERROR: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str(), ec.message().c_str());
		}
#endif

		// pick another target endpoint and try again
		m_target = make_udp(m_endpoints.front());

#ifndef TORRENT_DISABLE_LOGGING
		if (cb && cb->should_log())
		{
			cb->debug_log(R"(*** UDP_TRACKER trying next IP [ host: "%s" ip: "%s" ])"
				, m_hostname.c_str(), print_endpoint(m_target).c_str());
		}
#endif
		post(get_executor(), std::bind(
			&udp_tracker_connection::start_announce, shared_from_this()));

		aux::session_settings const& settings = m_man.settings();
		set_timeout(tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout)
			, settings.get_int(settings_pack::tracker_receive_timeout));
	}